

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecChoice.c
# Opt level: O0

void Cec_ManCombSpecReduce_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int Id;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pRepr;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  if (pObj->Value == 0xffffffff) {
    Id = Gia_ObjId(p,pObj);
    pObj_00 = Gia_ObjReprObj(p,Id);
    if (pObj_00 == (Gia_Obj_t *)0x0) {
      uVar3 = Cec_ManCombSpecReal(pNew,p,pObj);
      pObj->Value = uVar3;
    }
    else {
      Cec_ManCombSpecReduce_rec(pNew,p,pObj_00);
      uVar3 = pObj_00->Value;
      uVar1 = Gia_ObjPhase(pObj_00);
      uVar2 = Gia_ObjPhase(pObj);
      uVar3 = Abc_LitNotCond(uVar3,uVar1 ^ uVar2);
      pObj->Value = uVar3;
    }
  }
  return;
}

Assistant:

void Cec_ManCombSpecReduce_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pRepr;
    if ( ~pObj->Value )
        return;
    if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
    {
        Cec_ManCombSpecReduce_rec( pNew, p, pRepr );
        pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
        return;
    }
    pObj->Value = Cec_ManCombSpecReal( pNew, p, pObj );
}